

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O2

string * __thiscall
deqp::RobustBufferAccessBehavior::TexelFetchTest::getGeometryShader_abi_cxx11_
          (string *__return_storage_ptr__,TexelFetchTest *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 430 core\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nout vec2 gs_fs_tex_coord;\n\nvoid main()\n{\n    gs_fs_tex_coord = vec2(0, 0);\n    gl_Position     = vec4(-1, -1, 0, 1);\n    EmitVertex();\n\n    gs_fs_tex_coord = vec2(0, 1);\n    gl_Position     = vec4(-1, 1, 0, 1);\n    EmitVertex();\n\n    gs_fs_tex_coord = vec2(1, 0);\n    gl_Position     = vec4(1, -1, 0, 1);\n    EmitVertex();\n\n    gs_fs_tex_coord = vec2(1, 1);\n    gl_Position     = vec4(1, 1, 0, 1);\n    EmitVertex();\n}\n\n"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string TexelFetchTest::getGeometryShader()
{
	return std::string("#version 430 core\n"
					   "\n"
					   "layout(points)                           in;\n"
					   "layout(triangle_strip, max_vertices = 4) out;\n"
					   "\n"
					   "out vec2 gs_fs_tex_coord;\n"
					   "\n"
					   "void main()\n"
					   "{\n"
					   "    gs_fs_tex_coord = vec2(0, 0);\n"
					   "    gl_Position     = vec4(-1, -1, 0, 1);\n"
					   "    EmitVertex();\n"
					   "\n"
					   "    gs_fs_tex_coord = vec2(0, 1);\n"
					   "    gl_Position     = vec4(-1, 1, 0, 1);\n"
					   "    EmitVertex();\n"
					   "\n"
					   "    gs_fs_tex_coord = vec2(1, 0);\n"
					   "    gl_Position     = vec4(1, -1, 0, 1);\n"
					   "    EmitVertex();\n"
					   "\n"
					   "    gs_fs_tex_coord = vec2(1, 1);\n"
					   "    gl_Position     = vec4(1, 1, 0, 1);\n"
					   "    EmitVertex();\n"
					   "}\n"
					   "\n");
}